

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfSubscriber.c
# Opt level: O0

void messageCb(sbfSub sub,sbfBuffer_conflict buffer,void *closure)

{
  ulong uVar1;
  int iVar2;
  ulong *puVar3;
  uint64_t uVar4;
  sbfBuffer_conflict in_RSI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double interval;
  uint64_t this;
  uint64_t now;
  uint64_t *payload;
  undefined8 local_38;
  
  puVar3 = (ulong *)sbfBuffer_getData(in_RSI);
  uVar1 = *puVar3;
  local_38 = 0.0;
  iVar2 = sbfMw_checkSupported(1);
  if (iVar2 == 1) {
    uVar4 = sbfPerfCounter_get();
    if (uVar1 < uVar4) {
      local_38 = (double)sbfPerfCounter_microseconds(uVar4 - uVar1);
    }
    gTimeTotal = gTimeTotal +
                 ((long)local_38 | (long)(local_38 - 9.223372036854776e+18) & (long)local_38 >> 0x3f
                 );
    auVar5._8_4_ = (int)(gTimeLow >> 0x20);
    auVar5._0_8_ = gTimeLow;
    auVar5._12_4_ = 0x45300000;
    if (local_38 <
        (auVar5._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)gTimeLow) - 4503599627370496.0)) {
      gTimeLow = (long)local_38 | (long)(local_38 - 9.223372036854776e+18) & (long)local_38 >> 0x3f;
    }
    auVar6._8_4_ = (int)(gTimeHigh >> 0x20);
    auVar6._0_8_ = gTimeHigh;
    auVar6._12_4_ = 0x45300000;
    if ((auVar6._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)gTimeHigh) - 4503599627370496.0) < local_38) {
      gTimeHigh = (long)local_38 | (long)(local_38 - 9.223372036854776e+18) & (long)local_38 >> 0x3f
      ;
    }
  }
  gMessages = gMessages + 1;
  return;
}

Assistant:

static void
messageCb (sbfSub sub, sbfBuffer buffer, void* closure)
{
    uint64_t* payload = sbfBuffer_getData (buffer);
    uint64_t  now;
    uint64_t  this = *payload;
    double    interval = 0;

    if(CAP_HI_RES_COUNTER == sbfMw_checkSupported(CAP_HI_RES_COUNTER))
    {
        now = sbfPerfCounter_get ();
        if (now > this)
            interval = sbfPerfCounter_microseconds (now - this);
        gTimeTotal += (uint64_t)interval;
        if (interval < gTimeLow)
            gTimeLow = (uint64_t)interval;
        if (interval > gTimeHigh)
            gTimeHigh = (uint64_t)interval;
    }

    gMessages++;
}